

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.c
# Opt level: O2

int luaH_next(lua_State *L,Table *t,StkId key)

{
  byte bVar1;
  TValue *pTVar2;
  long lVar3;
  uint uVar4;
  ulong uVar5;
  TValue *io;
  long lVar6;
  Node *pNVar7;
  
  uVar4 = t->asize;
  if (((key->val).tt_ & 0xf) == 0) {
    uVar5 = 0;
  }
  else if (((key->val).tt_ != 3) ||
          (uVar5 = *(ulong *)key, (int)uVar5 == 0 || (ulong)uVar4 <= uVar5 - 1)) {
    pTVar2 = getgeneric(t,&key->val,1);
    if (pTVar2->tt_ == ' ') {
      luaG_runerror(L,"invalid key to \'next\'");
    }
    uVar5 = (ulong)(uVar4 + (int)(((long)pTVar2 - (long)t->node) / 0x18) + 1);
  }
  uVar5 = uVar5 & 0xffffffff;
  lVar6 = uVar5 << 0x20;
  lVar3 = ~uVar5 << 3;
  for (; lVar6 = lVar6 + 0x100000000, uVar5 < uVar4; uVar5 = uVar5 + 1) {
    bVar1 = *(byte *)((long)t->array + uVar5 + 4);
    if ((bVar1 & 0xf) != 0) {
      (key->val).value_.i = lVar6 >> 0x20;
      (key->val).tt_ = '\x03';
      *(byte *)((long)key + 0x18) = bVar1;
      key[1].val.value_ = *(Value *)((long)t->array + lVar3);
      return 1;
    }
    lVar3 = lVar3 + -8;
  }
  uVar4 = (int)uVar5 - uVar4;
  do {
    if (uVar4 >> (t->lsizenode & 0x1f) != 0) {
      return 0;
    }
    uVar5 = (ulong)uVar4;
    uVar4 = uVar4 + 1;
  } while ((*(byte *)((long)t->node + uVar5 * 0x18 + 8) & 0xf) == 0);
  pNVar7 = t->node + uVar5;
  (key->val).value_ = (pNVar7->u).key_val;
  (key->val).tt_ = (pNVar7->u).key_tt;
  key[1].val.value_ = (pNVar7->u).value_;
  *(lu_byte *)((long)key + 0x18) = (pNVar7->u).tt_;
  return 1;
}

Assistant:

int luaH_next (lua_State *L, Table *t, StkId key) {
  unsigned int asize = t->asize;
  unsigned int i = findindex(L, t, s2v(key), asize);  /* find original key */
  for (; i < asize; i++) {  /* try first array part */
    lu_byte tag = *getArrTag(t, i);
    if (!tagisempty(tag)) {  /* a non-empty entry? */
      setivalue(s2v(key), cast_int(i) + 1);
      farr2val(t, i, tag, s2v(key + 1));
      return 1;
    }
  }
  for (i -= asize; i < sizenode(t); i++) {  /* hash part */
    if (!isempty(gval(gnode(t, i)))) {  /* a non-empty entry? */
      Node *n = gnode(t, i);
      getnodekey(L, s2v(key), n);
      setobj2s(L, key + 1, gval(n));
      return 1;
    }
  }
  return 0;  /* no more elements */
}